

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O0

Maybe<kj::ArrayPtr<capnp::compiler::BrandedDecl>_> * __thiscall
capnp::compiler::BrandScope::getParams
          (Maybe<kj::ArrayPtr<capnp::compiler::BrandedDecl>_> *__return_storage_ptr__,
          BrandScope *this,uint64_t scopeId)

{
  BrandScope *this_00;
  Fault local_50;
  Fault f;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> *p;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> *_p358;
  uint64_t local_20;
  uint64_t scopeId_local;
  BrandScope *this_local;
  
  local_20 = scopeId;
  scopeId_local = (uint64_t)this;
  this_local = (BrandScope *)__return_storage_ptr__;
  if (scopeId == this->leafId) {
    if ((this->inherited & 1U) == 0) {
      __p358 = kj::Array<capnp::compiler::BrandedDecl>::asPtr(&this->params);
      kj::Maybe<kj::ArrayPtr<capnp::compiler::BrandedDecl>_>::Maybe
                (__return_storage_ptr__,(ArrayPtr<capnp::compiler::BrandedDecl> *)&_p358);
    }
    else {
      kj::Maybe<kj::ArrayPtr<capnp::compiler::BrandedDecl>_>::Maybe(__return_storage_ptr__);
    }
  }
  else {
    f.exception = (Exception *)
                  kj::_::readMaybe<capnp::compiler::BrandScope,decltype(nullptr)>(&this->parent);
    if (f.exception == (Exception *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                (&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.c++"
                 ,0x169,FAILED,(char *)0x0,"\"scope is not a parent\"",
                 (char (*) [22])"scope is not a parent");
      kj::_::Debug::Fault::fatal(&local_50);
    }
    this_00 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::get
                        ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)f.exception);
    getParams(__return_storage_ptr__,this_00,local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::ArrayPtr<BrandedDecl>> BrandScope::getParams(uint64_t scopeId) {
  // Returns null if params at the requested scope should be inherited from the client scope.

  if (scopeId == leafId) {
    if (inherited) {
      return kj::none;
    } else {
      return params.asPtr();
    }
  } else KJ_IF_SOME(p, parent) {
    return p.get()->getParams(scopeId);
  } else {
    KJ_FAIL_REQUIRE("scope is not a parent");
  }
}